

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t driver::zesFrequencyGetState(zes_freq_handle_t hFrequency,zes_freq_state_t *pState)

{
  zes_pfnFrequencyGetState_t pfnGetState;
  ze_result_t result;
  zes_freq_state_t *pState_local;
  zes_freq_handle_t hFrequency_local;
  
  pfnGetState._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cc30 != (code *)0x0) {
    pfnGetState._4_4_ = (*DAT_0011cc30)(hFrequency,pState);
  }
  return pfnGetState._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFrequencyGetState(
        zes_freq_handle_t hFrequency,                   ///< [in] Handle for the component.
        zes_freq_state_t* pState                        ///< [in,out] Frequency state for the specified domain.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetState = context.zesDdiTable.Frequency.pfnGetState;
        if( nullptr != pfnGetState )
        {
            result = pfnGetState( hFrequency, pState );
        }
        else
        {
            // generic implementation
        }

        return result;
    }